

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_4>>
::Visit<google::protobuf::DescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__4>>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  EnumDescriptor *pEVar1;
  FieldDescriptor *pFVar2;
  Descriptor *pDVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *pVVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  int iVar6;
  long lVar7;
  long lVar8;
  
  if (0 < descriptor->enum_type_count_) {
    lVar7 = 0;
    do {
      pEVar1 = descriptor->enum_types_;
      pVVar4 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,(int)lVar7)
      ;
      if (0 < pEVar1[lVar7].value_count_) {
        iVar6 = 0;
        do {
          RepeatedPtrFieldBase::
          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                    (&(pVVar4->field_0)._impl_.value_.super_RepeatedPtrFieldBase,iVar6);
          iVar6 = iVar6 + 1;
        } while (iVar6 < pEVar1[lVar7].value_count_);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < descriptor->enum_type_count_);
  }
  if (0 < descriptor->oneof_decl_count_) {
    iVar6 = 0;
    do {
      RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,iVar6);
      iVar6 = iVar6 + 1;
    } while (iVar6 < descriptor->oneof_decl_count_);
  }
  if (0 < descriptor->field_count_) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pFVar2 = descriptor->fields_;
      pVVar5 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,(int)lVar8);
      DescriptorBuilder::PostProcessFieldFeatures
                (*(DescriptorBuilder **)this,(FieldDescriptor *)(&pFVar2->super_SymbolBase + lVar7),
                 pVVar5);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x58;
    } while (lVar8 < descriptor->field_count_);
  }
  if (0 < descriptor->nested_type_count_) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pDVar3 = descriptor->nested_types_;
      proto_00 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                            (int)lVar8);
      Visit<google::protobuf::DescriptorProto_const>
                (this,(Descriptor *)(&pDVar3->super_SymbolBase + lVar7),proto_00);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0xa0;
    } while (lVar8 < descriptor->nested_type_count_);
  }
  if (0 < descriptor->extension_count_) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pFVar2 = descriptor->extensions_;
      pVVar5 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,(int)lVar8)
      ;
      DescriptorBuilder::PostProcessFieldFeatures
                (*(DescriptorBuilder **)this,(FieldDescriptor *)(&pFVar2->super_SymbolBase + lVar7),
                 pVVar5);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x58;
    } while (lVar8 < descriptor->extension_count_);
  }
  if (0 < descriptor->extension_range_count_) {
    iVar6 = 0;
    do {
      RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,iVar6);
      iVar6 = iVar6 + 1;
    } while (iVar6 < descriptor->extension_range_count_);
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }